

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O0

int Mig_ManSuppSizeTest(Mig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Mig_Obj_t *pMVar5;
  abctime aVar6;
  bool bVar7;
  abctime clk;
  Mig_Obj_t *pMStack_18;
  int Counter;
  Mig_Obj_t *pObj;
  Mig_Man_t *p_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  p->iPage = 0;
  while( true ) {
    iVar2 = p->iPage;
    iVar1 = Vec_PtrSize(&p->vPages);
    bVar7 = false;
    if (iVar2 < iVar1) {
      pMVar5 = (Mig_Obj_t *)Vec_PtrEntry(&p->vPages,p->iPage);
      p->pPage = pMVar5;
      bVar7 = pMVar5 != (Mig_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pMStack_18 = p->pPage;
    while( true ) {
      iVar2 = Mig_ObjIsNone(pMStack_18);
      if (iVar2 != 0) break;
      iVar2 = Mig_ObjIsNode(pMStack_18);
      if (iVar2 != 0) {
        iVar2 = Mig_ManSuppSizeOne(pMStack_18);
        clk._4_4_ = (iVar2 < 0x11) + clk._4_4_;
      }
      pMStack_18 = pMStack_18 + 1;
    }
    p->iPage = p->iPage + 1;
  }
  uVar3 = Mig_ManNodeNum(p);
  printf("Nodes with small support %d (out of %d)\n",(ulong)clk._4_4_,(ulong)uVar3);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar4);
  return clk._4_4_;
}

Assistant:

int Mig_ManSuppSizeTest( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    int Counter = 0;
    abctime clk = Abc_Clock();
    Mig_ManForEachObj( p, pObj )
        if ( Mig_ObjIsNode(pObj) )
            Counter += (Mig_ManSuppSizeOne(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Mig_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}